

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall
Outputs::Display::OpenGL::Shader::set_uniform
          (Shader *this,string *name,GLint size,GLsizei count,GLuint *values)

{
  string *this_00;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  allocator_type local_80 [32];
  GLint local_60;
  GLsizei GStack_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Shader *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values_copy;
  
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&values_copy,values,
             values + (long)size * (long)count,local_80);
  std::__cxx11::string::string((string *)local_80,(string *)name);
  local_60 = size;
  GStack_5c = count;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,&values_copy);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_40 = this;
  this_00 = (string *)operator_new(0x48);
  std::__cxx11::string::string(this_00,(string *)local_80);
  *(ulong *)(this_00 + 0x20) = CONCAT44(GStack_5c,local_60);
  *(pointer *)(this_00 + 0x28) =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(this_00 + 0x30) =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(this_00 + 0x38) =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(Shader **)(this_00 + 0x40) = local_40;
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp:261:19)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp:261:19)>
             ::_M_manager;
  local_a8._M_unused._0_8_ = (undefined8)this_00;
  enqueue_function(this,(function<void_()> *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  set_uniform(std::__cxx11::string_const&,int,int,unsigned_int_const*)::$_0::~__0((__0 *)local_80);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&values_copy.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void Shader::set_uniform(const std::string &name, GLint size, GLsizei count, const GLuint *values) {
	std::size_t number_of_values = std::size_t(count) * std::size_t(size);
	std::vector<GLuint> values_copy(values, values + number_of_values);

	enqueue_function([name, size, count, values_copy, this] {
		switch(size) {
			case 1: with_location(glUniform1uiv, count, values_copy.data());	break;
			case 2: with_location(glUniform2uiv, count, values_copy.data());	break;
			case 3: with_location(glUniform3uiv, count, values_copy.data());	break;
			case 4: with_location(glUniform4uiv, count, values_copy.data());	break;
		}
	});
}